

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

bool GUIComponentLoad(string *path,
                     vector<GUIComponent,_std::allocator<GUIComponent>_> *out_components)

{
  char cVar1;
  bool bVar2;
  istream *piVar3;
  float value;
  float y;
  float z;
  float w;
  GUIComponent comp;
  string type;
  string uniformName;
  string line;
  ifstream file;
  istringstream iss;
  
  std::ifstream::ifstream(&file,(string *)path,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&file,(string *)&line);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&line,_S_in);
      uniformName._M_dataplus._M_p = (pointer)&uniformName.field_2;
      uniformName._M_string_length = 0;
      uniformName.field_2._M_local_buf[0] = '\0';
      type._M_dataplus._M_p = (pointer)&type.field_2;
      type._M_string_length = 0;
      type.field_2._M_local_buf[0] = '\0';
      piVar3 = std::operator>>((istream *)&iss,(string *)&uniformName);
      std::operator>>(piVar3,(string *)&type);
      comp._48_8_ = 0;
      comp.Data[1] = 0.0;
      comp.Data[2] = 0.0;
      comp.UniformName.field_2._8_8_ = 0;
      comp._40_8_ = 0;
      comp.UniformName._M_string_length = 0;
      comp.UniformName.field_2._M_allocated_capacity = 0;
      comp.Type = EGUIComponentTypeSlider1;
      comp.UniformType = EGUIUniformTypeFloat;
      comp.UniformName._M_dataplus._M_p = (pointer)0x0;
      comp.Data[3] = 0.0;
      comp._68_4_ = 0;
      bVar2 = std::operator==(&type,"s1");
      if (bVar2) {
        std::istream::_M_extract<float>((float *)&iss);
        comp._0_8_ = comp._0_8_ & 0xffffffff00000000;
        std::__cxx11::string::_M_assign((string *)&comp.UniformName);
        comp.Data[0] = value;
      }
      else {
        bVar2 = std::operator==(&type,"s2");
        if (bVar2) {
          piVar3 = std::istream::_M_extract<float>((float *)&iss);
          std::istream::_M_extract<float>((float *)piVar3);
          comp.Type = EGUIComponentTypeSlider2;
          std::__cxx11::string::_M_assign((string *)&comp.UniformName);
          comp.Data[0] = value;
          comp.Data[1] = y;
        }
        else {
          bVar2 = std::operator==(&type,"s3");
          if (bVar2) {
            piVar3 = std::istream::_M_extract<float>((float *)&iss);
            piVar3 = std::istream::_M_extract<float>((float *)piVar3);
            std::istream::_M_extract<float>((float *)piVar3);
            comp.Type = EGUIComponentTypeSlider3;
            std::__cxx11::string::_M_assign((string *)&comp.UniformName);
LAB_00115c7c:
            comp.Data[0] = value;
            comp.Data[2] = z;
            comp.Data[1] = y;
          }
          else {
            bVar2 = std::operator==(&type,"s4");
            if (bVar2) {
              piVar3 = std::istream::_M_extract<float>((float *)&iss);
              piVar3 = std::istream::_M_extract<float>((float *)piVar3);
              piVar3 = std::istream::_M_extract<float>((float *)piVar3);
              std::istream::_M_extract<float>((float *)piVar3);
              comp.Type = EGUIComponentTypeSlider4;
              std::__cxx11::string::_M_assign((string *)&comp.UniformName);
            }
            else {
              bVar2 = std::operator==(&type,"c3");
              if (bVar2) {
                piVar3 = std::istream::_M_extract<float>((float *)&iss);
                piVar3 = std::istream::_M_extract<float>((float *)piVar3);
                std::istream::_M_extract<float>((float *)piVar3);
                comp.Type = EGUIComponentTypeColor3;
                std::__cxx11::string::_M_assign((string *)&comp.UniformName);
                goto LAB_00115c7c;
              }
              bVar2 = std::operator==(&type,"c4");
              if (!bVar2) goto LAB_00115d35;
              piVar3 = std::istream::_M_extract<float>((float *)&iss);
              piVar3 = std::istream::_M_extract<float>((float *)piVar3);
              piVar3 = std::istream::_M_extract<float>((float *)piVar3);
              std::istream::_M_extract<float>((float *)piVar3);
              comp.Type = EGUIComponentTypeColor4;
              std::__cxx11::string::_M_assign((string *)&comp.UniformName);
            }
            comp.Data[0] = value;
            comp.Data[2] = z;
            comp.Data[1] = y;
            comp.Data[3] = w;
          }
        }
      }
LAB_00115d35:
      std::vector<GUIComponent,_std::allocator<GUIComponent>_>::push_back(out_components,&comp);
      std::__cxx11::string::~string((string *)&comp.UniformName);
      std::__cxx11::string::~string((string *)&type);
      std::__cxx11::string::~string((string *)&uniformName);
      std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
    }
    std::ifstream::close();
    std::__cxx11::string::~string((string *)&line);
  }
  std::ifstream::~ifstream(&file);
  return (bool)cVar1;
}

Assistant:

bool GUIComponentLoad(const std::string& path, std::vector<GUIComponent>& out_components) {
    std::ifstream file(path);
    
    if (!file.is_open()) {
        return false;
    }
    
    std::string line;
    while (std::getline(file, line)) {
        std::istringstream iss(line);
        std::string uniformName;
        std::string type;
        iss >> uniformName >> type;
        GUIComponent comp;
        if (type == "s1") {
            float value;
            iss >> value;
            comp.Type = EGUIComponentTypeSlider1;
            comp.UniformName = uniformName;
            comp.Data[0] = value;
        } else if (type == "s2") {
            float x, y;
            iss >> x >> y;
            comp.Type = EGUIComponentTypeSlider2;
            comp.UniformName = uniformName;
            comp.Data[0] = x;
            comp.Data[1] = y;
        } else if (type == "s3") {
            float x, y, z;
            iss >> x >> y >> z;
            comp.Type = EGUIComponentTypeSlider3;
            comp.UniformName = uniformName;
            comp.Data[0] = x;
            comp.Data[1] = y;
            comp.Data[2] = z;
        } else if (type == "s4") {
            float x, y, z, w;
            iss >> x >> y >> z >> w;
            comp.Type = EGUIComponentTypeSlider4;
            comp.UniformName = uniformName;
            comp.Data[0] = x;
            comp.Data[1] = y;
            comp.Data[2] = z;
            comp.Data[3] = w;
        } else if (type == "c3") {
            float x, y, z;
            iss >> x >> y >> z;
            comp.Type = EGUIComponentTypeColor3;
            comp.UniformName = uniformName;
            comp.Data[0] = x;
            comp.Data[1] = y;
            comp.Data[2] = z;
        } else if (type == "c4") {
            float x, y, z, w;
            iss >> x >> y >> z >> w;
            comp.Type = EGUIComponentTypeColor4;
            comp.UniformName = uniformName;
            comp.Data[0] = x;
            comp.Data[1] = y;
            comp.Data[2] = z;
            comp.Data[3] = w;
        }
        out_components.push_back(comp);
    }
    
    file.close();
    return true;
}